

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EasyScreenCapturer.cpp
# Opt level: O3

shared_ptr<media::EasyScreenCapturer> media::EasyScreenCapturer::GetInstance(void)

{
  _func_int **pp_Var1;
  EasyScreenCapturerLinux *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  shared_ptr<media::EasyScreenCapturer> sVar2;
  
  if (m_pInstance == (_func_int **)0x0) {
    this = (EasyScreenCapturerLinux *)operator_new(8);
    EasyScreenCapturerLinux::EasyScreenCapturerLinux(this);
    std::__shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>::
    reset<media::EasyScreenCapturerLinux>
              ((__shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2> *)&m_pInstance,
               this);
    in_RDX._M_pi = extraout_RDX;
  }
  in_RDI->_vptr_EasyScreenCapturer = m_pInstance;
  pp_Var1 = DAT_00106120;
  in_RDI[1]._vptr_EasyScreenCapturer = DAT_00106120;
  if (pp_Var1 != (_func_int **)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
      UNLOCK();
    }
    else {
      *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
    }
  }
  sVar2.super___shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar2.super___shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<media::EasyScreenCapturer>)
         sVar2.super___shared_ptr<media::EasyScreenCapturer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<EasyScreenCapturer> EasyScreenCapturer::GetInstance()
{
  if (!m_pInstance)
  {
#ifdef OS_WIN
    m_pInstance.reset(new EasyScreenCapturerWin());
#elif defined(OS_UNIX)
    m_pInstance.reset(new EasyScreenCapturerLinux());
#else
    m_pInstance.reset(new EasyScreenCapturerFaker());
#endif
  }

  return m_pInstance;
}